

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 34_findFirstAndLastPositionInSortedArray.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
searchRange(vector<int,_std::allocator<int>_> *__return_storage_ptr__,
           vector<int,_std::allocator<int>_> *nums,int target)

{
  pointer piVar1;
  int iVar2;
  ulong uVar3;
  allocator_type *__a;
  int iVar5;
  ulong uVar6;
  int *piVar7;
  uint uVar8;
  int iVar9;
  initializer_list<int> __l;
  allocator_type local_19;
  undefined8 local_18;
  int local_10;
  int local_c;
  ulong uVar4;
  
  piVar1 = (nums->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar3 = (ulong)((long)(nums->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar1) >> 2;
  iVar9 = 0;
  uVar4 = uVar3 & 0xffffffff;
  while (uVar6 = uVar4, iVar5 = (int)uVar6, iVar9 < iVar5) {
    uVar8 = (uint)(iVar9 + iVar5) >> 1;
    uVar4 = (ulong)uVar8;
    if (piVar1[uVar8] < target) {
      iVar9 = uVar8 + 1;
      uVar4 = uVar6;
    }
  }
  iVar5 = 0;
  while (uVar4 = uVar3, iVar2 = (int)uVar4, iVar5 < iVar2) {
    uVar8 = (uint)(iVar5 + iVar2) >> 1;
    uVar3 = (ulong)uVar8;
    if (piVar1[uVar8] <= target) {
      iVar5 = uVar8 + 1;
      uVar3 = uVar4;
    }
  }
  if (iVar9 == iVar5) {
    piVar7 = (int *)&local_18;
    local_18 = 0xffffffffffffffff;
    __a = &local_19;
  }
  else {
    piVar7 = &local_10;
    local_c = iVar5 + -1;
    __a = (allocator_type *)&local_18;
    local_10 = iVar9;
  }
  __l._M_len = 2;
  __l._M_array = piVar7;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__l,__a);
  return __return_storage_ptr__;
}

Assistant:

vector<int> searchRange(vector<int>& nums, int target) {
    int start=0,end=nums.size(),mid,left,right;
    while (start<end)
    {
        mid=(start+end)/2;
        if (target<=nums[mid])
            end=mid;
        else
            start=mid+1;
    }
    left=start;
    start=0,end=nums.size();
    while (start<end)
    {
        mid=(start+end)/2;
        if (target<nums[mid])
            end=mid;
        else
            start=mid+1;
    }
    right=start;
    return left==right ? vector<int> {-1,-1} : vector<int>{left,right-1};
}